

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts-seq.c
# Opt level: O3

Result * parTreeSearch(Result *__return_storage_ptr__,int depth,Node *parent)

{
  int iVar1;
  int iVar2;
  counter_t cVar3;
  int spawnnumber;
  int iVar4;
  int iVar5;
  counter_t cVar6;
  Result c;
  Node child;
  ulong local_90;
  Result local_68;
  Node local_50;
  
  iVar4 = parent->height;
  local_90 = (ulong)depth;
  __return_storage_ptr__->maxdepth = local_90;
  __return_storage_ptr__->size = 1;
  iVar1 = uts_numChildren(parent);
  iVar2 = uts_childType(parent);
  parent->numChildren = iVar1;
  if (iVar1 < 1) {
    cVar6 = 1;
  }
  else {
    iVar4 = iVar4 + 1;
    cVar3 = 1;
    spawnnumber = 0;
    cVar6 = 0;
    do {
      local_50.numChildren = -1;
      local_50.type = iVar2;
      local_50.height = iVar4;
      if (0 < computeGranularity) {
        iVar5 = 0;
        do {
          rng_spawn((parent->state).state,local_50.state.state,spawnnumber);
          iVar5 = iVar5 + 1;
        } while (iVar5 < computeGranularity);
      }
      parTreeSearch(&local_68,depth + 1,&local_50);
      if (local_90 < local_68.maxdepth) {
        local_90 = local_68.maxdepth;
      }
      cVar3 = cVar3 + local_68.size;
      cVar6 = cVar6 + local_68.leaves;
      spawnnumber = spawnnumber + 1;
    } while (spawnnumber != iVar1);
    __return_storage_ptr__->maxdepth = local_90;
    __return_storage_ptr__->size = cVar3;
  }
  __return_storage_ptr__->leaves = cVar6;
  return __return_storage_ptr__;
}

Assistant:

Result parTreeSearch(int depth, Node *parent) {
  int numChildren, childType;
  counter_t parentHeight = parent->height;

  Result r = { depth, 1, 0 };

  numChildren = uts_numChildren(parent);
  childType   = uts_childType(parent);

  // record number of children in parent
  parent->numChildren = numChildren;
  
  // Recurse on the children
  if (numChildren > 0) {
    int i, j;
    for (i = 0; i < numChildren; i++) {
      Node child;
      child.type = childType;
      child.height = parentHeight + 1;
      child.numChildren = -1;    // not yet determined
      for (j = 0; j < computeGranularity; j++) {
        rng_spawn(parent->state.state, child.state.state, i);
      }
      Result c = parTreeSearch(depth+1, &child);
      if (c.maxdepth>r.maxdepth) r.maxdepth = c.maxdepth;
      r.size += c.size;
      r.leaves += c.leaves;
    }
  } else {
    r.leaves = 1;
  }

  return r;
}